

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O1

shared_ptr<gui::LabelStyle> __thiscall gui::DefaultTheme::makeLabelStyle(DefaultTheme *this)

{
  Gui *__args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<gui::LabelStyle> sVar1;
  undefined1 local_29;
  Vector3f local_28;
  
  __args = *(Gui **)(in_RSI + 8);
  (this->super_Theme)._vptr_Theme = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<gui::LabelStyle,std::allocator<gui::LabelStyle>,gui::Gui_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_Theme).gui_,
             (LabelStyle **)this,(allocator<gui::LabelStyle> *)&local_29,__args);
  LabelStyle::setFont((LabelStyle *)(this->super_Theme)._vptr_Theme,*(Font **)(in_RSI + 0x48));
  LabelStyle::setCharacterSize((LabelStyle *)(this->super_Theme)._vptr_Theme,0xf);
  LabelStyle::setTextFillColor
            ((LabelStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::Black);
  local_28.z = *(float *)(in_RSI + 0x50);
  local_28.x = 8.0;
  local_28.y = 1.0;
  LabelStyle::setTextPadding((LabelStyle *)(this->super_Theme)._vptr_Theme,&local_28);
  sVar1.super___shared_ptr<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::LabelStyle>)
         sVar1.super___shared_ptr<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LabelStyle> DefaultTheme::makeLabelStyle() const {
    auto style = std::make_shared<LabelStyle>(gui_);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(sf::Color::Black);

    style->setTextPadding({8.0f, 1.0f, fontMaxHeightRatio_});

    return style;
}